

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
compute_zeroth_persistence
          (persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
           *this,unsigned_short min_dimension,unsigned_short param_2)

{
  iterator *piVar1;
  ushort uVar2;
  unsigned_long uVar3;
  directed_flag_complex_computer_t *pdVar4;
  filtered_directed_graph_t *pfVar5;
  pointer puVar6;
  pair<float,_int> *ppVar7;
  pointer pfVar8;
  uint uVar9;
  pointer pfVar10;
  pointer pfVar11;
  ulong uVar12;
  uint uVar13;
  ostream *poVar14;
  long *plVar15;
  int iVar16;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  char *__to;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  pair<float,_int> pVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  vector<filtration_index_t,_std::allocator<filtration_index_t>_> edges;
  filtration_index_t e;
  filtered_union_find dset;
  float local_110;
  float local_10c;
  vector<filtration_index_t,_std::allocator<filtration_index_t>_> local_108;
  vector<float,_std::allocator<float>_> local_e8;
  _Map_pointer ppfStack_d0;
  unsigned_long local_c0;
  deque<filtration_index_t,std::allocator<filtration_index_t>> *local_b8;
  filtered_union_find local_b0;
  pair<float,_int> local_68;
  pair<float,_int> local_60;
  pair<float,_int> local_58;
  _Elt_pointer pfStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ulong uVar17;
  
  directed_flag_complex_computer::directed_flag_complex_computer_t::prepare_next_dimension
            (this->complex,0);
  if (min_dimension < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"computing persistent homology in dimension 0",0x2c);
    poVar14 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\r",1);
    uVar3 = *(this->complex->cell_count).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_e8,&this->complex->graph->vertex_filtration);
    filtered_union_find::filtered_union_find(&local_b0,&local_e8);
    local_c0 = uVar3;
    if ((pair<float,_int>)
        local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pair<float,_int>)0x0) {
      operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (filtration_index_t *)0x0;
    uVar22 = (uint)(this->complex->cell_count).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[1];
    if (0 < (int)uVar22) {
      lVar23 = 0;
      uVar25 = 0;
      do {
        if (this->complex->filtration_algorithm == (filtration_algorithm_t *)0x0) {
          fVar27 = 0.0;
        }
        else {
          fVar27 = (this->complex->graph->edge_filtration).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start[uVar25];
        }
        if (fVar27 <= this->max_filtration) {
          local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)((ulong)(uint)fVar27 + lVar23);
          if (local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<filtration_index_t,_std::allocator<filtration_index_t>_>::
            _M_realloc_insert<filtration_index_t>
                      (&local_108,
                       (iterator)
                       local_108.
                       super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(filtration_index_t *)&local_e8);
          }
          else {
            *local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
             _M_impl.super__Vector_impl_data._M_finish =
                 (filtration_index_t)
                 local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((long)local_108.
                                 super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 8);
          }
        }
        pfVar11 = local_108.
                  super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pfVar10 = local_108.
                  super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar25 = uVar25 + 1;
        lVar23 = lVar23 + 0x100000000;
      } while ((uVar22 & 0x7fffffff) != uVar25);
      if ((long)local_108.
                super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_108.
                super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)local_108.
                            super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
        local_58 = (pair<float,_int>)
                   local_108.
                   super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        uVar25 = (long)local_108.
                       super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_108.
                       super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar23 = 0x3f;
        if (uVar25 != 0) {
          for (; uVar25 >> lVar23 == 0; lVar23 = lVar23 + -1) {
          }
        }
        std::
        __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<filtration_index_t*,std::vector<filtration_index_t,std::allocator<filtration_index_t>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<greater_filtration_or_smaller_index<filtration_index_t>>>
                  (&local_e8,&local_58,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
        local_60 = (pair<float,_int>)pfVar11;
        local_68 = (pair<float,_int>)pfVar10;
        std::
        __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<filtration_index_t*,std::vector<filtration_index_t,std::allocator<filtration_index_t>>>>,__gnu_cxx::__ops::_Iter_comp_iter<greater_filtration_or_smaller_index<filtration_index_t>>>
                  ();
      }
    }
    (*this->output->_vptr_output_t[5])(this->output,0);
    pfVar10 = local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_b8 = (deque<filtration_index_t,std::allocator<filtration_index_t>> *)
                 &this->columns_to_reduce;
      pVar24 = (pair<float,_int>)
               local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = *(pointer *)pVar24;
        pdVar4 = this->complex;
        pfVar5 = pdVar4->graph;
        puVar6 = (pfVar5->super_directed_graph_t).edges.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar25 = (long)(int)((ulong)local_e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 0x1f) * 2;
        uVar2 = *(ushort *)((long)puVar6 + (uVar25 & 0xfffffffffffffffc));
        uVar20 = (ulong)uVar2;
        uVar22 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20];
        uVar18 = (uint)uVar2;
        uVar19 = uVar22;
        if (uVar22 != uVar18) {
          do {
            uVar18 = uVar19;
            uVar19 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar18];
          } while (local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar18] != uVar18);
        }
        uVar2 = *(ushort *)((long)puVar6 + (uVar25 | 2));
        uVar25 = (ulong)uVar2;
        for (; uVar18 != uVar22;
            uVar22 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar22]) {
          local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar20] = uVar18;
          uVar20 = (ulong)uVar22;
        }
        uVar22 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar25];
        __to = (char *)(ulong)uVar2;
        uVar19 = uVar22;
        if (uVar22 != uVar2) {
          do {
            __to = (char *)(ulong)uVar19;
            bVar26 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar19] != uVar19;
            uVar19 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar19];
          } while (bVar26);
        }
        for (; uVar19 = (uint)__to, uVar19 != uVar22;
            uVar22 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar22]) {
          local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar25] = uVar19;
          uVar25 = (ulong)uVar22;
        }
        if (uVar18 == uVar19) {
          ppVar7 = &((this->columns_to_reduce).
                     super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur)->super_pair<float,_int>;
          if (ppVar7 == &(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_last[-1].super_pair<float,_int>
             ) {
            std::deque<filtration_index_t,std::allocator<filtration_index_t>>::
            _M_push_back_aux<filtration_index_t_const&>(local_b8,(filtration_index_t *)&local_e8);
          }
          else {
            *ppVar7 = (pair<float,_int>)
                      local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar1 = &(this->columns_to_reduce).
                      super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
        }
        else {
          if (pdVar4->filtration_algorithm == (filtration_algorithm_t *)0x0) {
            local_110 = 0.0;
            local_10c = 0.0;
          }
          else {
            pfVar8 = (pfVar5->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            local_10c = pfVar8[(int)uVar18];
            local_110 = pfVar8[(int)uVar19];
          }
          filtered_union_find::link(&local_b0,(char *)(ulong)uVar18,__to);
          if (min_dimension == 0) {
            fVar27 = local_110;
            if (local_110 <= local_10c) {
              fVar27 = local_10c;
            }
            if (fVar27 < local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) {
              uVar22 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar18];
              uVar13 = uVar22;
              uVar9 = uVar18;
              uVar19 = uVar18;
              if (uVar22 != uVar18) {
                do {
                  uVar19 = uVar13;
                  uVar13 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(int)uVar19];
                } while (local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar19] != uVar19);
              }
              while (uVar13 = uVar22, uVar19 != uVar13) {
                local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar9] = uVar19;
                uVar9 = uVar13;
                uVar22 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar13];
              }
              if (uVar19 != uVar18) {
                local_110 = local_10c;
              }
              (*this->output->_vptr_output_t[6])
                        (local_110,
                         local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_);
            }
          }
        }
        pVar24 = (pair<float,_int>)((long)pVar24 + 8);
      } while (pVar24 != (pair<float,_int>)pfVar10);
    }
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(this->columns_to_reduce).
                        super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_first;
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)(this->columns_to_reduce).
                  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl
                  .super__Deque_impl_data._M_start._M_last;
    ppfStack_d0 = (this->columns_to_reduce).
                  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl
                  .super__Deque_impl_data._M_start._M_node;
    local_58 = (pair<float,_int>)
               (this->columns_to_reduce).
               super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    pfStack_50 = (this->columns_to_reduce).
                 super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_first;
    local_48 = *(undefined4 *)
                &(this->columns_to_reduce).
                 super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_last;
    uStack_44 = *(undefined4 *)
                 ((long)&(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_last + 4);
    uStack_40 = *(undefined4 *)
                 &(this->columns_to_reduce).
                  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_node;
    uStack_3c = *(undefined4 *)
                 ((long)&(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_node + 4);
    std::__reverse<std::_Deque_iterator<filtration_index_t,filtration_index_t&,filtration_index_t*>>
              ();
    if (min_dimension != 1) {
      uVar22 = (uint)local_c0;
      if ((int)uVar22 < 1) {
        lVar23 = 0;
      }
      else {
        uVar25 = 0;
        lVar23 = 0;
        do {
          uVar19 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar25];
          uVar20 = uVar25 & 0xffffffff;
          uVar18 = uVar19;
          if (uVar25 != uVar19) {
            do {
              uVar20 = (ulong)uVar18;
              bVar26 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar18] != uVar18;
              uVar18 = local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar18];
            } while (bVar26);
          }
          uVar12 = (ulong)uVar19;
          uVar21 = uVar25 & 0xffffffff;
          while( true ) {
            uVar17 = uVar12;
            iVar16 = (int)uVar17;
            if ((int)uVar20 == iVar16) break;
            local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar21] = (int)uVar20;
            uVar12 = (ulong)(uint)local_b0.parent.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar16];
            uVar21 = uVar17;
          }
          if (uVar25 == uVar20) {
            if (this->complex->filtration_algorithm == (filtration_algorithm_t *)0x0) {
              fVar27 = 0.0;
            }
            else {
              fVar27 = (this->complex->graph->vertex_filtration).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar25];
            }
            (*this->output->_vptr_output_t[7])(fVar27);
            lVar23 = lVar23 + 1;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != (uVar22 & 0x7fffffff));
      }
      (*this->output->_vptr_output_t[9])(this->output,lVar23,0);
      if (this->print_betti_numbers_to_console == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"The dimensions of the mod-",0x1a);
        poVar14 = (ostream *)std::ostream::operator<<(&std::cout,this->modulus);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," homology of the full complex are:",0x22);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        plVar15 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
        std::ostream::put((char)plVar15);
        poVar14 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"dim H_0 = ",10);
        poVar14 = std::ostream::_M_insert<long_long>((longlong)poVar14);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
      }
      this->euler_characteristic = this->euler_characteristic + (int)lVar23;
    }
    if ((pair<float,_int>)
        local_108.super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (pair<float,_int>)0x0) {
      operator_delete(local_108.
                      super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<filtration_index_t,_std::allocator<filtration_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.filtration.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.filtration.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.rank.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.rank.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.rank.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.rank.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void compute_zeroth_persistence(unsigned short min_dimension, unsigned short) {
		complex.prepare_next_dimension(0);

		// Only compute this if we actually need it
		if (min_dimension > 1) return;

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing persistent homology in dimension 0" << std::flush << "\r";
#endif

		long long betti_number = 0;
#ifdef RETRIEVE_PERSISTENCE
		std::vector<std::pair<value_t, value_t>> birth_death;
#endif
		size_t n = complex.number_of_cells(0);
		filtered_union_find dset(complex.vertex_filtration());
		std::vector<filtration_index_t> edges;
		index_t number_of_edges = index_t(complex.number_of_cells(1));
		for (index_t index = 0; index < number_of_edges; index++) {
			value_t filtration = complex.filtration(1, index);
			if (filtration <= max_filtration) edges.push_back(std::make_pair(filtration, index));
		}
		std_algorithms::sort(edges.rbegin(), edges.rend(), greater_filtration_or_smaller_index<filtration_index_t>());

		// Let the output class know that we are now computing zeroth degree barcodes
		output->computing_barcodes_in_dimension(0);

		for (auto e : edges) {
			const auto vertices = complex.vertices_of_edge(get_index(e));
			index_t u = dset.find(vertices.first), v = dset.find(vertices.second);

			if (u != v) {
				// Only output bars if we are interested in zeroth homology
				const auto filtration_u = complex.filtration(0, u);
				const auto filtration_v = complex.filtration(0, v);
				dset.link(u, v);
				if (min_dimension == 0 && get_filtration(e) > std::max(filtration_u, filtration_v)) {
					// Check which vertex is merged into which other vertex.
					const auto f = dset.find(u) == u ? filtration_v : filtration_u;
					output->new_barcode(f, get_filtration(e));
#ifdef RETRIEVE_PERSISTENCE
					birth_death.push_back(std::make_pair(f, get_filtration(e)));
#endif
				}
			} else {
				columns_to_reduce.push_back(e);
			}
		}
		std::reverse(columns_to_reduce.begin(), columns_to_reduce.end());

		// If we don't care about zeroth homology, then we can stop here
		if (min_dimension == 1) return;

		for (index_t index = 0; index < index_t(n); ++index) {
			if (dset.find(index) == index) {
				output->new_infinite_barcode(complex.filtration(0, index));
				betti_number++;
#ifdef RETRIEVE_PERSISTENCE
				birth_death.push_back(
				    std::make_pair(complex.filtration(0, index), std::numeric_limits<value_t>::infinity()));
#endif
			}
		}

#ifdef RETRIEVE_PERSISTENCE
		betti_numbers.push_back(betti_number);
		birth_deaths_by_dim.push_back(birth_death);
#endif
		// Report the betti number back to the complex and the output
		complex.computation_result(0, betti_number, 0);
		output->betti_number(betti_number, 0);

		if (print_betti_numbers_to_console) {
			std::cout << "\033[K"
			          << "The dimensions of the mod-" << modulus << " homology of the full complex are:" << std::endl
			          << std::endl
			          << "dim H_0 = " << betti_number << std::endl;
		}
		euler_characteristic += index_t(betti_number);
	}